

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_BREP
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  ON_Interval proxy_curve_subdomain;
  ON_Interval real_curve_subdomain;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ON_Brep *this_00;
  ON_Curve *pOVar4;
  ON_NurbsSurface *pOVar5;
  ON_BrepVertex *pOVar6;
  ON_BrepEdge *this_01;
  ON_BrepTrim *this_02;
  ON_BrepLoop *pOVar7;
  ON_BrepFace *pOVar8;
  int iVar9;
  byte bVar10;
  int sz;
  bool bHaveMat;
  int j;
  ON__UINT32 tcode;
  int version;
  ON__INT64 big_value;
  ON_Curve *curve;
  double tol3d;
  double tol2d;
  ON_3dPoint m_oldTrim_mP [2];
  uint local_d4;
  bool local_cd;
  TYPE local_cc;
  ON_3dmObjectAttributes *local_c8;
  uint local_c0;
  ON__INT32 local_bc;
  ON_SimpleArray<ON_Surface_*> *local_b8;
  ON__INT64 local_b0;
  ON_BoundingBox local_a8;
  double local_78;
  double local_70;
  double local_68 [3];
  double local_50 [4];
  
  local_cd = false;
  local_c0 = 0;
  local_b0 = 0;
  bVar2 = BeginRead3dmBigChunk(this,&local_c0,&local_b0);
  if (bVar2) {
    if (local_c0 == 0x2fffe) {
      local_bc = -1;
      bVar2 = ReadInt32(this,1,&local_bc);
      bVar10 = 1;
      bVar1 = 1;
      if (bVar2) {
        if (local_bc - 0x66U < 0xfffffffe) {
          bVar1 = 0;
          goto LAB_003ac3b4;
        }
        this_00 = (ON_Brep *)operator_new(0x138);
        ON_Brep::ON_Brep(this_00);
        bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_d4);
        if ((!bVar2) || ((long)(int)local_d4 < 1)) goto LAB_003ac3b7;
        if ((uint)(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_d4) {
          ON_SimpleArray<ON_Curve_*>::SetCapacity
                    (&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_d4);
        }
        local_c8 = pAttributes;
        if ((int)local_d4 < 1) {
          iVar9 = 0;
        }
        else {
          iVar9 = 0;
          do {
            pOVar4 = ReadV1_RHINOIO_BREP_CURVE(this);
            local_a8.m_min.x._0_4_ = (uint)pOVar4;
            local_a8.m_min.x._4_4_ = (undefined4)((ulong)pOVar4 >> 0x20);
            if (pOVar4 == (ON_Curve *)0x0) break;
            ON_SimpleArray<ON_Curve_*>::Append
                      (&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_a8);
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)local_d4);
        }
        pAttributes = local_c8;
        if (iVar9 < (int)local_d4) goto LAB_003ac4d1;
        bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_d4);
        bVar10 = 1;
        pAttributes = local_c8;
        if ((!bVar2) || ((long)(int)local_d4 < 1)) goto LAB_003ac3b7;
        if ((uint)(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_d4) {
          ON_SimpleArray<ON_Curve_*>::SetCapacity
                    (&(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_d4);
        }
        if ((int)local_d4 < 1) {
          iVar9 = 0;
        }
        else {
          iVar9 = 0;
          do {
            pOVar4 = ReadV1_RHINOIO_BREP_CURVE(this);
            local_a8.m_min.x._0_4_ = (uint)pOVar4;
            local_a8.m_min.x._4_4_ = (undefined4)((ulong)pOVar4 >> 0x20);
            if (pOVar4 == (ON_Curve *)0x0) break;
            ON_SimpleArray<ON_Curve_*>::Append
                      (&(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_a8);
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)local_d4);
        }
        pAttributes = local_c8;
        if (iVar9 < (int)local_d4) goto LAB_003ac4d1;
        bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_d4);
        pAttributes = local_c8;
        bVar10 = 1;
        if ((!bVar2) || ((long)(int)local_d4 < 1)) goto LAB_003ac3b7;
        local_b8 = &(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>;
        if ((uint)(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity < local_d4) {
          ON_SimpleArray<ON_Surface_*>::SetCapacity(local_b8,(long)(int)local_d4);
        }
        if ((int)local_d4 < 1) {
          iVar9 = 0;
        }
        else {
          iVar9 = 0;
          while( true ) {
            local_c0 = 0;
            local_b0 = 0;
            bVar2 = BeginRead3dmBigChunk(this,&local_c0,&local_b0);
            if (!bVar2) break;
            if (local_c0 == 0x20009) {
              pOVar5 = ReadV1_RHINOIO_NURBS_SURFACE_OBJECT_DATA(this);
            }
            else {
              pOVar5 = (ON_NurbsSurface *)0x0;
            }
            bVar2 = EndRead3dmChunk(this,false);
            if ((pOVar5 == (ON_NurbsSurface *)0x0) || (!bVar2)) break;
            local_a8.m_min.x._0_4_ = (uint)pOVar5;
            local_a8.m_min.x._4_4_ = (undefined4)((ulong)pOVar5 >> 0x20);
            ON_SimpleArray<ON_Surface_*>::Append(local_b8,(ON_Surface **)&local_a8);
            iVar9 = iVar9 + 1;
            if ((int)local_d4 <= iVar9) break;
          }
        }
        bVar10 = 1;
        if (iVar9 < (int)local_d4) goto LAB_003ac3b7;
        ReadInt32(this,1,(ON__INT32 *)&local_d4);
        if ((uint)(this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                  super_ON_ClassArray<ON_BrepVertex>.m_capacity < local_d4) {
          ON_ClassArray<ON_BrepVertex>::SetCapacity
                    ((ON_ClassArray<ON_BrepVertex> *)&this_00->m_V,(long)(int)local_d4);
        }
        if ((int)local_d4 < 1) {
          iVar9 = 0;
        }
        else {
          iVar9 = 0;
          while( true ) {
            pOVar6 = ON_Brep::NewVertex(this_00);
            bVar2 = ReadInt32(this,1,&pOVar6->m_vertex_index);
            if (((!bVar2) || (bVar2 = ReadDouble(this,3,&(pOVar6->super_ON_Point).point.x), !bVar2))
               || (bVar2 = ReadArray(this,&pOVar6->m_ei), !bVar2)) break;
            bVar2 = ReadDouble(this,1,&pOVar6->m_tolerance);
            if ((!bVar2) || (iVar9 = iVar9 + 1, (int)local_d4 <= iVar9)) break;
          }
        }
        if (iVar9 < (int)local_d4) {
LAB_003ac4d1:
          bVar2 = false;
          bVar10 = 1;
        }
        else {
          ReadInt32(this,1,(ON__INT32 *)&local_d4);
          if ((uint)(this_00->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                    super_ON_ClassArray<ON_BrepEdge>.m_capacity < local_d4) {
            ON_ClassArray<ON_BrepEdge>::SetCapacity
                      ((ON_ClassArray<ON_BrepEdge> *)&this_00->m_E,(long)(int)local_d4);
          }
          if ((int)local_d4 < 1) {
            iVar9 = 0;
          }
          else {
            iVar9 = 0;
            while( true ) {
              ON_Interval::ON_Interval((ON_Interval *)&local_a8);
              this_01 = ON_Brep::NewEdge(this_00,-1);
              bVar2 = ReadInt32(this,1,&this_01->m_edge_index);
              if (((!bVar2) || (bVar2 = ReadInt32(this,1,&this_01->m_c3i), !bVar2)) ||
                 (bVar2 = ReadDouble(this,2,(double *)&local_a8), !bVar2)) break;
              proxy_curve_subdomain.m_t[0]._4_4_ = local_a8.m_min.x._4_4_;
              proxy_curve_subdomain.m_t[0]._0_4_ = local_a8.m_min.x._0_4_;
              proxy_curve_subdomain.m_t[1] = local_a8.m_min.y;
              ON_CurveProxy::SetProxyCurveDomain
                        (&this_01->super_ON_CurveProxy,proxy_curve_subdomain);
              bVar2 = ReadInt32(this,2,this_01->m_vi);
              if ((((!bVar2) || (bVar2 = ReadArray(this,&this_01->m_ti), !bVar2)) ||
                  (bVar2 = ReadDouble(this,1,&this_01->m_tolerance), !bVar2)) ||
                 (iVar9 = iVar9 + 1, (int)local_d4 <= iVar9)) break;
            }
          }
          pAttributes = local_c8;
          if (iVar9 < (int)local_d4) goto LAB_003ac4d1;
          ReadInt32(this,1,(ON__INT32 *)&local_d4);
          if ((uint)(this_00->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                    super_ON_ClassArray<ON_BrepTrim>.m_capacity < local_d4) {
            ON_ClassArray<ON_BrepTrim>::SetCapacity
                      ((ON_ClassArray<ON_BrepTrim> *)&this_00->m_T,(long)(int)local_d4);
          }
          if ((int)local_d4 < 1) {
            iVar9 = 0;
          }
          else {
            iVar9 = 0;
            while( true ) {
              this_02 = ON_Brep::NewTrim(this_00,-1);
              bVar2 = ReadInt32(this,1,&this_02->m_trim_index);
              if ((!bVar2) || (bVar2 = ReadInt32(this,1,&this_02->m_c2i), !bVar2)) break;
              ON_Interval::ON_Interval((ON_Interval *)&local_a8);
              bVar2 = ReadDouble(this,2,(double *)&local_a8);
              if (!bVar2) break;
              real_curve_subdomain.m_t[0]._4_4_ = local_a8.m_min.x._4_4_;
              real_curve_subdomain.m_t[0]._0_4_ = local_a8.m_min.x._0_4_;
              real_curve_subdomain.m_t[1] = local_a8.m_min.y;
              ON_CurveProxy::SetProxyCurve
                        (&this_02->super_ON_CurveProxy,(ON_Curve *)0x0,real_curve_subdomain);
              bVar2 = ReadInt32(this,1,&this_02->m_ei);
              if ((!bVar2) || (bVar2 = ReadInt32(this,2,this_02->m_vi), !bVar2)) break;
              local_cc = (TYPE)this_02->m_bRev3d;
              bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_cc);
              if (!bVar2) break;
              this_02->m_bRev3d = local_cc != unknown;
              bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_cc);
              if (!bVar2) break;
              if (local_cc - outer < 4) {
                this_02->m_type = local_cc;
              }
              bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_cc);
              if ((((!bVar2) || (bVar2 = ReadInt32(this,1,&this_02->m_li), !bVar2)) ||
                  (bVar2 = ReadDouble(this,2,this_02->m_tolerance), !bVar2)) ||
                 (((bVar2 = ReadDouble(this,3,local_68), !bVar2 ||
                   (bVar2 = ReadDouble(this,3,local_50), !bVar2)) ||
                  ((bVar2 = ReadDouble(this,1,&local_70), !bVar2 ||
                   ((bVar2 = ReadDouble(this,1,&local_78), !bVar2 ||
                    (iVar9 = iVar9 + 1, (int)local_d4 <= iVar9)))))))) break;
            }
          }
          pAttributes = local_c8;
          if (iVar9 < (int)local_d4) goto LAB_003ac4d1;
          ReadInt32(this,1,(ON__INT32 *)&local_d4);
          if ((uint)(this_00->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                    super_ON_ClassArray<ON_BrepLoop>.m_capacity < local_d4) {
            ON_ClassArray<ON_BrepLoop>::SetCapacity
                      ((ON_ClassArray<ON_BrepLoop> *)&this_00->m_L,(long)(int)local_d4);
          }
          if ((int)local_d4 < 1) {
            iVar9 = 0;
          }
          else {
            iVar9 = 0;
            while( true ) {
              pOVar7 = ON_Brep::NewLoop(this_00,unknown);
              bVar2 = ReadInt32(this,1,&pOVar7->m_loop_index);
              if (((!bVar2) || (bVar2 = ReadArray(this,&pOVar7->m_ti), !bVar2)) ||
                 (bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_cc), !bVar2)) break;
              if (local_cc - outer < 3) {
                pOVar7->m_type = local_cc;
              }
              bVar2 = ReadInt32(this,1,&pOVar7->m_fi);
              if ((!bVar2) || (iVar9 = iVar9 + 1, (int)local_d4 <= iVar9)) break;
            }
          }
          pAttributes = local_c8;
          if (iVar9 < (int)local_d4) goto LAB_003ac4d1;
          ReadInt32(this,1,(ON__INT32 *)&local_d4);
          if ((uint)(this_00->m_F).super_ON_ObjectArray<ON_BrepFace>.
                    super_ON_ClassArray<ON_BrepFace>.m_capacity < local_d4) {
            ON_ClassArray<ON_BrepFace>::SetCapacity
                      ((ON_ClassArray<ON_BrepFace> *)&this_00->m_F,(long)(int)local_d4);
          }
          if ((int)local_d4 < 1) {
            iVar9 = 0;
          }
          else {
            iVar9 = 0;
            do {
              pOVar8 = ON_Brep::NewFace(this_00,-1);
              bVar2 = ReadInt32(this,1,&pOVar8->m_face_index);
              if (((!bVar2) || (bVar2 = ReadArray(this,&pOVar8->m_li), !bVar2)) ||
                 (bVar2 = ReadInt32(this,1,&pOVar8->m_si), !bVar2)) break;
              local_a8.m_min.x._0_4_ = (uint)pOVar8->m_bRev;
              bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_a8);
              if (!bVar2) break;
              pOVar8->m_bRev = local_a8.m_min.x._0_4_ != 0;
              iVar9 = iVar9 + 1;
            } while (iVar9 < (int)local_d4);
          }
          pAttributes = local_c8;
          if (iVar9 < (int)local_d4) goto LAB_003ac4d1;
          ON_BoundingBox::ON_BoundingBox(&local_a8);
          bVar2 = ReadDouble(this,3,(double *)&local_a8);
          if (bVar2) {
            bVar2 = ReadDouble(this,3,&local_a8.m_max.x);
            bVar3 = !bVar2;
          }
          else {
            bVar3 = true;
            bVar2 = false;
          }
          bVar10 = bVar3 | bVar2;
          pAttributes = local_c8;
        }
      }
      else {
LAB_003ac3b4:
        bVar10 = bVar1;
        this_00 = (ON_Brep *)0x0;
LAB_003ac3b7:
        bVar2 = false;
      }
      if (bVar10 == 0) goto LAB_003ac3bf;
    }
    else {
      this_00 = (ON_Brep *)0x0;
      bVar2 = false;
    }
    bVar3 = EndRead3dmChunk(this,false);
    bVar2 = (bool)(this_00 != (ON_Brep *)0x0 & bVar3 & bVar2);
    if (bVar2 == true) {
      ON_Brep::SetTrimIsoFlags(this_00);
      *ppObject = (ON_Object *)this_00;
    }
    else if (this_00 != (ON_Brep *)0x0) {
      (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
    }
    if (bVar2 != false) {
      Read3dmV1AttributesOrMaterial
                (this,pAttributes,(ON_Material *)0x0,&local_cd,0x2ffff,(ON__3dmV1_XDATA *)0x0);
    }
  }
  else {
LAB_003ac3bf:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_BREP(
  ON_Object** ppObject,
  ON_3dmObjectAttributes* pAttributes
  )
{
  ON_3dPoint m_oldTrim_mP[2];
  bool bHaveMat = false;
  bool rc = false;
  ON_Brep* brep = 0;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  if ( !BeginRead3dmBigChunk( &tcode, &big_value ) )
    return false;
  if ( tcode == TCODE_RHINOIO_OBJECT_DATA ) for (;;) {
    int version = -1;
    int sz, i, j;
    double tol2d, tol3d;
    if ( !ReadInt( &version ) ) 
      break; // serialization version
    // version = 100 means the b-rep was written by the RhinoIO toolkit
    // version = 101 means the b-rep was written by Rhino 1.0
    if ( version != 100 && version != 101 ) {
      return false;
    }

    brep = new ON_Brep();

    // 2d trimming curves
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_C2.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_Curve* curve = ReadV1_RHINOIO_BREP_CURVE( *this );
      if ( !curve )
        break;
      brep->m_C2.Append(curve);
    }
    if ( i < sz )
      break;

    // 3d trimming curves
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_C3.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_Curve* curve = ReadV1_RHINOIO_BREP_CURVE( *this );
      if ( !curve )
        break;
      brep->m_C3.Append(curve);
    }
    if ( i < sz )
      break;

    // 3d untrimmed surfaces
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_S.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_NurbsSurface* surface = 0;
      tcode = 0;
      big_value = 0;
      if ( !BeginRead3dmBigChunk(&tcode,&big_value) )
        break;
      if ( tcode == TCODE_RHINOIO_OBJECT_NURBS_SURFACE ) {
        surface = ReadV1_RHINOIO_NURBS_SURFACE_OBJECT_DATA( *this );
      }
      if ( !EndRead3dmChunk() )
        break;
      if ( !surface )
        break;
      brep->m_S.Append(surface);
    }
    if ( i < sz )
      break;

    // vertices
    ReadInt( &sz );
    brep->m_V.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepVertex& vertex = brep->NewVertex();
      if ( !ReadInt( &vertex.m_vertex_index ) ) break;
      if ( !ReadPoint( vertex.point ) ) break;
      if ( !ReadArray( vertex.m_ei ) ) break;
      if ( !ReadDouble( &vertex.m_tolerance ) ) break;
    }
    if ( i < sz )
      break;

    // edges
    ReadInt( &sz );
    brep->m_E.Reserve(sz);
    for ( i = 0; i < sz; i++ ) 
    {
      ON_Interval proxy_domain;
      ON_BrepEdge& edge = brep->NewEdge();
      if ( !ReadInt( &edge.m_edge_index ) ) break;
      if ( !ReadInt( &edge.m_c3i ) ) break;
      if ( !ReadInterval( proxy_domain ) ) break;
      edge.SetProxyCurveDomain(proxy_domain);
      if ( !ReadInt( 2, edge.m_vi ) ) break;
      if ( !ReadArray( edge.m_ti ) ) break;
      if ( !ReadDouble( &edge.m_tolerance ) ) break;
    }
    if ( i < sz )
      break;

    // trims
    ReadInt( &sz );
    brep->m_T.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepTrim& trim = brep->NewTrim();
      if ( !ReadInt( &trim.m_trim_index ) ) break;
      if ( !ReadInt( &trim.m_c2i ) ) break;
      ON_Interval d;
      if ( !ReadInterval( d ) ) 
        break;
      trim.SetProxyCurve(nullptr,d);
      if ( !ReadInt( &trim.m_ei ) ) break;
      if ( !ReadInt( 2, trim.m_vi ) ) break;
      j = trim.m_bRev3d;
      if ( !ReadInt( &j ) ) break;
      trim.m_bRev3d = (j!=0);
      if ( !ReadInt( &j ) ) break;
      switch(j) {
      case 1: trim.m_type = ON_BrepTrim::boundary; break;
      case 2: trim.m_type = ON_BrepTrim::mated; break;
      case 3: trim.m_type = ON_BrepTrim::seam; break;
      case 4: trim.m_type = ON_BrepTrim::singular; break;
      }
      if ( !ReadInt( &j ) ) break; // legacy iso flag - ignore and recaluate
      if ( !ReadInt( &trim.m_li ) ) break;
      if ( !ReadDouble( 2, trim.m_tolerance ) ) break;
      if ( !ReadPoint( m_oldTrim_mP[0] ) ) break;
      if ( !ReadPoint( m_oldTrim_mP[1] ) ) break;
      if ( !ReadDouble( &tol2d ) ) break;
      if ( !ReadDouble( &tol3d ) ) break;
    }
    if ( i < sz )
      break;

    // loops
    ReadInt( &sz );
    brep->m_L.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepLoop& loop = brep->NewLoop(ON_BrepLoop::unknown);
      if ( !ReadInt( &loop.m_loop_index ) ) break;
      if ( !ReadArray( loop.m_ti ) ) break;
      if ( !ReadInt( &j ) ) break;
      switch (j) {
      case 1: loop.m_type = ON_BrepLoop::outer; break;
      case 2: loop.m_type = ON_BrepLoop::inner; break;
      case 3: loop.m_type = ON_BrepLoop::slit; break;
      }
      if ( !ReadInt( &loop.m_fi ) ) break;
    }
    if ( i < sz )
      break;

    // faces
    ReadInt( &sz );
    brep->m_F.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepFace& face = brep->NewFace();
      if ( !ReadInt( &face.m_face_index ) ) break;
      if ( !ReadArray( face.m_li ) ) break;
      if ( !ReadInt( &face.m_si ) ) break;
      int k = face.m_bRev;
      if ( !ReadInt( &k ) ) break;
      face.m_bRev = (k!=0);
    }
    if ( i < sz )
      break;

    // bounding box
    {
      ON_BoundingBox bbox;
      if ( !ReadPoint( bbox.m_min ) ) break;
      if ( !ReadPoint( bbox.m_max ) ) break;
    }

    rc = true;
    break;
  }
  if ( !EndRead3dmChunk() )
    rc = false;
  if ( rc && brep ) {
    brep->SetTrimIsoFlags();
    *ppObject = brep;
  }
  else {
    if ( brep )
      delete brep;
    rc = false;
  }

  if ( rc && brep ) {
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_RHINOIO_OBJECT_END);
  }

  return rc;
}